

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-chat.cpp
# Opt level: O0

string * trim(string *str)

{
  int iVar1;
  char *pcVar2;
  ulong in_RSI;
  string *in_RDI;
  bool bVar3;
  size_t end;
  size_t start;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20 = std::__cxx11::string::size();
  while( true ) {
    bVar3 = false;
    if (local_18 < local_20) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      iVar1 = isspace((int)*pcVar2);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    local_18 = local_18 + 1;
  }
  while( true ) {
    bVar3 = false;
    if (local_18 < local_20) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      iVar1 = isspace((int)*pcVar2);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    local_20 = local_20 - 1;
  }
  std::__cxx11::string::substr((ulong)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

static std::string trim(const std::string & str) {
    size_t start = 0;
    size_t end = str.size();
    while (start < end && isspace(str[start])) {
        start += 1;
    }
    while (end > start && isspace(str[end - 1])) {
        end -= 1;
    }
    return str.substr(start, end - start);
}